

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_inet_socket_address.c
# Opt level: O3

void test_init_inet_socket_address(void)

{
  cio_error cVar1;
  uint8_t ipv4_address [4];
  cio_inet_address address;
  cio_socket_address sock_addr;
  uint8_t local_94 [4];
  cio_inet_address local_90;
  cio_socket_address local_7c;
  
  local_94[0] = 0xac;
  local_94[1] = '\x13';
  local_94[2] = '\x01';
  local_94[3] = '\x01';
  cVar1 = cio_init_inet_address(&local_90,local_94,4);
  UnityAssertEqualNumber
            (0,(long)cVar1,"initialization of IPv4 inet address failed!",0x36,
             UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_init_inet_socket_address(&local_7c,&local_90,0xc);
  UnityAssertEqualNumber
            (0,(long)cVar1,"initialization of inet socket address failed!",0x3a,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_init_inet_socket_address(void)
{
	uint8_t ipv4_address[4] = {172, 19, 1, 1};
	struct cio_inet_address address;
	enum cio_error err = cio_init_inet_address(&address, ipv4_address, sizeof(ipv4_address));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of IPv4 inet address failed!");

	struct cio_socket_address sock_addr;
	err = cio_init_inet_socket_address(&sock_addr, &address, 12);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "initialization of inet socket address failed!");
}